

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

void __thiscall implementations::scheme::cell::cell(cell *this,cell *copy)

{
  this->type = copy->type;
  std::__cxx11::string::string((string *)&this->val,(string *)&copy->val);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::vector
            (&this->list,&copy->list);
  this->proc = copy->proc;
  std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->env).
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>,
             &(copy->env).
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

cell(const cell &copy) : type(copy.type), val(copy.val), list(copy.list), proc(copy.proc), env(copy.env) {}